

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupHalfSeq(Gia_Man_t *p,int fSecond)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  Gia_Man_t *pNew;
  Gia_Obj_t *pObj;
  int i;
  int fSecond_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  Gia_ManFillValue(p);
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  if (fSecond == 0) {
    pObj._0_4_ = 0;
    while( true ) {
      iVar1 = Gia_ManPiNum(p);
      bVar5 = false;
      if ((int)pObj < iVar1) {
        pNew = (Gia_Man_t *)Gia_ManCi(p,(int)pObj);
        bVar5 = pNew != (Gia_Man_t *)0x0;
      }
      if (!bVar5) break;
      iVar1 = Gia_ManAppendCi(p_00);
      *(int *)&pNew->pSpec = iVar1;
      pObj._0_4_ = (int)pObj + 1;
    }
    pObj._0_4_ = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar5 = false;
      if ((int)pObj < iVar1) {
        iVar1 = Gia_ManPiNum(p);
        pNew = (Gia_Man_t *)Gia_ManCi(p,iVar1 + (int)pObj);
        bVar5 = pNew != (Gia_Man_t *)0x0;
      }
      if (!bVar5) break;
      iVar1 = Gia_ManRegNum(p);
      if (iVar1 / 2 <= (int)pObj) {
        iVar1 = Gia_ManAppendCi(p_00);
        *(int *)&pNew->pSpec = iVar1;
      }
      pObj._0_4_ = (int)pObj + 1;
    }
    pObj._0_4_ = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar5 = false;
      if ((int)pObj < iVar1) {
        iVar1 = Gia_ManPiNum(p);
        pNew = (Gia_Man_t *)Gia_ManCi(p,iVar1 + (int)pObj);
        bVar5 = pNew != (Gia_Man_t *)0x0;
      }
      if (!bVar5) break;
      iVar1 = Gia_ManRegNum(p);
      if ((int)pObj < iVar1 / 2) {
        iVar1 = Gia_ManAppendCi(p_00);
        *(int *)&pNew->pSpec = iVar1;
      }
      pObj._0_4_ = (int)pObj + 1;
    }
    pObj._0_4_ = 0;
    while( true ) {
      iVar1 = Gia_ManPoNum(p);
      bVar5 = false;
      if ((int)pObj < iVar1) {
        pNew = (Gia_Man_t *)Gia_ManCo(p,(int)pObj);
        bVar5 = pNew != (Gia_Man_t *)0x0;
      }
      if (!bVar5) break;
      Gia_ManDupOrderDfs_rec(p_00,p,(Gia_Obj_t *)pNew);
      pObj._0_4_ = (int)pObj + 1;
    }
    pObj._0_4_ = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar5 = false;
      if ((int)pObj < iVar1) {
        iVar1 = Gia_ManPoNum(p);
        pNew = (Gia_Man_t *)Gia_ManCo(p,iVar1 + (int)pObj);
        bVar5 = pNew != (Gia_Man_t *)0x0;
      }
      if (!bVar5) break;
      iVar1 = Gia_ManRegNum(p);
      if ((int)pObj < iVar1 / 2) {
        Gia_ManDupOrderDfs_rec(p_00,p,(Gia_Obj_t *)pNew);
      }
      pObj._0_4_ = (int)pObj + 1;
    }
    iVar1 = Gia_ManRegNum(p);
    Gia_ManSetRegNum(p_00,iVar1 / 2);
  }
  else {
    pObj._0_4_ = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCis);
      bVar5 = false;
      if ((int)pObj < iVar1) {
        pNew = (Gia_Man_t *)Gia_ManCi(p,(int)pObj);
        bVar5 = pNew != (Gia_Man_t *)0x0;
      }
      if (!bVar5) break;
      iVar1 = Gia_ManAppendCi(p_00);
      *(int *)&pNew->pSpec = iVar1;
      pObj._0_4_ = (int)pObj + 1;
    }
    pObj._0_4_ = 0;
    while( true ) {
      iVar1 = Gia_ManPoNum(p);
      bVar5 = false;
      if ((int)pObj < iVar1) {
        pNew = (Gia_Man_t *)Gia_ManCo(p,(int)pObj);
        bVar5 = pNew != (Gia_Man_t *)0x0;
      }
      if (!bVar5) break;
      Gia_ManDupOrderDfs_rec(p_00,p,(Gia_Obj_t *)pNew);
      pObj._0_4_ = (int)pObj + 1;
    }
    pObj._0_4_ = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar5 = false;
      if ((int)pObj < iVar1) {
        iVar1 = Gia_ManPoNum(p);
        pNew = (Gia_Man_t *)Gia_ManCo(p,iVar1 + (int)pObj);
        bVar5 = pNew != (Gia_Man_t *)0x0;
      }
      if (!bVar5) break;
      iVar1 = Gia_ManRegNum(p);
      if (iVar1 / 2 <= (int)pObj) {
        Gia_ManDupOrderDfs_rec(p_00,p,(Gia_Obj_t *)pNew);
      }
      pObj._0_4_ = (int)pObj + 1;
    }
    iVar1 = Gia_ManRegNum(p);
    iVar2 = Gia_ManRegNum(p);
    Gia_ManSetRegNum(p_00,iVar1 - iVar2 / 2);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupHalfSeq( Gia_Man_t * p, int fSecond )
{
    int i; Gia_Obj_t * pObj;
    Gia_Man_t * pNew = Gia_ManStart( Gia_ManObjNum(p) ); 
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    if ( fSecond )
    {
        Gia_ManForEachCi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachPo( p, pObj, i )
            Gia_ManDupOrderDfs_rec( pNew, p, pObj );
        Gia_ManForEachRi( p, pObj, i )
            if ( i >= Gia_ManRegNum(p)/2 )
                Gia_ManDupOrderDfs_rec( pNew, p, pObj );
        Gia_ManSetRegNum( pNew, Gia_ManRegNum(p)- Gia_ManRegNum(p)/2 );
    }
    else
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachRo( p, pObj, i )
            if ( i >= Gia_ManRegNum(p)/2 )
                pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachRo( p, pObj, i )
            if ( i < Gia_ManRegNum(p)/2 )
                pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachPo( p, pObj, i )
            Gia_ManDupOrderDfs_rec( pNew, p, pObj );
        Gia_ManForEachRi( p, pObj, i )
            if ( i < Gia_ManRegNum(p)/2 )
                Gia_ManDupOrderDfs_rec( pNew, p, pObj );
        Gia_ManSetRegNum( pNew, Gia_ManRegNum(p)/2 );
    }
    return pNew;
}